

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserAnimation.cpp
# Opt level: O0

bool Rml::PropertyParserAnimation::ParseAnimation(Property *property,StringList *animation_values)

{
  bool bVar1;
  bool bVar2;
  pointer this;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar6;
  pointer ppVar7;
  size_type sVar8;
  undefined8 uVar9;
  ulong uVar10;
  const_iterator cVar11;
  bool local_1c9;
  int local_190;
  float local_18c;
  int count;
  float number;
  pointer pAStack_180;
  pointer local_178;
  Property local_168;
  int local_114;
  const_iterator local_110;
  undefined1 local_100 [8];
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *argument;
  iterator __end2;
  iterator __begin2;
  StringList *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8 [5];
  bool num_iterations_found;
  bool delay_found;
  bool duration_found;
  StringList arguments;
  undefined1 local_a0 [8];
  Animation animation;
  String *single_animation_value;
  const_iterator __end1;
  const_iterator __begin1;
  StringList *__range1;
  AnimationList animation_list;
  StringList *animation_values_local;
  Property *property_local;
  
  animation_list.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)animation_values;
  ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::vector
            ((vector<Rml::Animation,_std::allocator<Rml::Animation>_> *)&__range1);
  this = animation_list.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  __end1 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)animation_list.
                      super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  single_animation_value =
       (String *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&single_animation_value);
    if (!bVar3) break;
    animation.name.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    Animation::Animation((Animation *)local_a0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_c8);
    StringUtilities::ExpandString((StringList *)local_c8,(String *)animation.name.field_2._8_8_,' ')
    ;
    bVar1 = false;
    bVar2 = false;
    bVar3 = false;
    __end2 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_c8);
    argument = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_c8);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&argument);
      if (!bVar4) break;
      it.mInfo = (uint8_t *)
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      uVar10 = ::std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        pTVar6 = &ControlledLifetimeResource<Rml::PropertyParserAnimationData>::operator->
                            ((ControlledLifetimeResource<Rml::PropertyParserAnimationData> *)
                             parser_data)->keywords;
        cVar11 = robin_hood::detail::
                 Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(pTVar6,(key_type *)it.mInfo);
        it.mKeyVals = (NodePtr)cVar11.mInfo;
        local_100 = (undefined1  [8])cVar11.mKeyVals;
        pTVar6 = &ControlledLifetimeResource<Rml::PropertyParserAnimationData>::operator->
                            ((ControlledLifetimeResource<Rml::PropertyParserAnimationData> *)
                             parser_data)->keywords;
        cVar11 = robin_hood::detail::
                 Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pTVar6);
        local_110 = cVar11;
        bVar4 = robin_hood::detail::
                Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                ::Iter<true>::operator!=((Iter<true> *)local_100,&local_110);
        local_1c9 = false;
        if (bVar4) {
          ppVar7 = robin_hood::detail::
                   Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::Iter<true>::operator->((Iter<true> *)local_100);
          local_1c9 = Keyword::ValidAnimation(&ppVar7->second);
        }
        if (local_1c9 == false) {
          local_18c = 0.0;
          local_190 = 0;
          uVar9 = ::std::__cxx11::string::c_str();
          iVar5 = __isoc99_sscanf(uVar9,"%fs%n",&local_18c,&local_190);
          if (iVar5 == 1) {
            if (local_190 < 1) {
              if (bVar3) {
                property_local._7_1_ = 0;
                local_114 = 1;
                goto LAB_005df408;
              }
              animation.delay = (float)Math::RoundToInteger(local_18c);
              bVar3 = true;
            }
            else if (bVar1) {
              if (bVar2) {
                property_local._7_1_ = 0;
                local_114 = 1;
                goto LAB_005df408;
              }
              bVar2 = true;
              animation.tween.callback._0_4_ = local_18c;
            }
            else {
              bVar1 = true;
              local_a0._0_4_ = local_18c;
            }
          }
          else {
            ::std::__cxx11::string::operator=
                      ((string *)&animation.num_iterations,(string *)it.mInfo);
          }
        }
        else {
          ppVar7 = robin_hood::detail::
                   Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::Iter<true>::operator->((Iter<true> *)local_100);
          switch((ppVar7->second).type) {
          case None:
            sVar8 = ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::size
                              ((vector<Rml::Animation,_std::allocator<Rml::Animation>_> *)&__range1)
            ;
            if (sVar8 == 0) {
              _count = (pointer)0x0;
              pAStack_180 = (pointer)0x0;
              local_178 = (pointer)0x0;
              ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::vector
                        ((vector<Rml::Animation,_std::allocator<Rml::Animation>_> *)&count);
              Property::Property<std::vector<Rml::Animation,std::allocator<Rml::Animation>>>
                        (&local_168,
                         (vector<Rml::Animation,_std::allocator<Rml::Animation>_> *)&count,ANIMATION
                         ,-1);
              Property::operator=(property,&local_168);
              Property::~Property(&local_168);
              ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::~vector
                        ((vector<Rml::Animation,_std::allocator<Rml::Animation>_> *)&count);
              property_local._7_1_ = 1;
              local_114 = 1;
            }
            else {
              property_local._7_1_ = 0;
              local_114 = 1;
            }
            goto LAB_005df408;
          case Tween:
            ppVar7 = robin_hood::detail::
                     Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::Iter<true>::operator->((Iter<true> *)local_100);
            animation.duration = (float)(ppVar7->second).tween.type_in;
            animation._4_4_ = (ppVar7->second).tween.type_out;
            animation.tween._0_8_ = (ppVar7->second).tween.callback;
            break;
          default:
            break;
          case Alternate:
            animation.tween.callback._4_1_ = 1;
            break;
          case Infinite:
            if (bVar3) {
              property_local._7_1_ = 0;
              local_114 = 1;
              goto LAB_005df408;
            }
            animation.delay = -NAN;
            bVar3 = true;
            break;
          case Paused:
            animation.tween.callback._5_1_ = 1;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    uVar10 = ::std::__cxx11::string::empty();
    if (((((uVar10 & 1) != 0) || ((float)local_a0._0_4_ <= 0.0)) || ((int)animation.delay < -1)) ||
       (animation.delay == 0.0)) {
      property_local._7_1_ = 0;
      local_114 = 1;
    }
    else {
      ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::push_back
                ((vector<Rml::Animation,_std::allocator<Rml::Animation>_> *)&__range1,
                 (value_type *)local_a0);
      local_114 = 0;
    }
LAB_005df408:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_c8);
    Animation::~Animation((Animation *)local_a0);
    if (local_114 != 0) goto LAB_005df47e;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  Variant::operator=(&property->value,
                     (vector<Rml::Animation,_std::allocator<Rml::Animation>_> *)&__range1);
  property->unit = ANIMATION;
  property_local._7_1_ = 1;
  local_114 = 1;
LAB_005df47e:
  ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::~vector
            ((vector<Rml::Animation,_std::allocator<Rml::Animation>_> *)&__range1);
  return (bool)(property_local._7_1_ & 1);
}

Assistant:

bool PropertyParserAnimation::ParseAnimation(Property& property, const StringList& animation_values)
{
	AnimationList animation_list;

	for (const String& single_animation_value : animation_values)
	{
		Animation animation;

		StringList arguments;
		StringUtilities::ExpandString(arguments, single_animation_value, ' ');

		bool duration_found = false;
		bool delay_found = false;
		bool num_iterations_found = false;

		for (auto& argument : arguments)
		{
			if (argument.empty())
				continue;

			// See if we have a <keyword> or <tween> specifier as defined in keywords
			auto it = parser_data->keywords.find(argument);
			if (it != parser_data->keywords.end() && it->second.ValidAnimation())
			{
				switch (it->second.type)
				{
				case KeywordType::None:
				{
					if (animation_list.size() > 0) // The none keyword can not be part of multiple definitions
						return false;
					property = Property{AnimationList{}, Unit::ANIMATION};
					return true;
				}
				break;
				case KeywordType::Tween: animation.tween = it->second.tween; break;
				case KeywordType::Alternate: animation.alternate = true; break;
				case KeywordType::Infinite:
					if (num_iterations_found)
						return false;
					animation.num_iterations = -1;
					num_iterations_found = true;
					break;
				case KeywordType::Paused: animation.paused = true; break;
				default: break;
				}
			}
			else
			{
				// Either <duration>, <delay>, <num_iterations> or a <keyframes-name>
				float number = 0.0f;
				int count = 0;

				if (sscanf(argument.c_str(), "%fs%n", &number, &count) == 1)
				{
					// Found a number, if there was an 's' unit, count will be positive
					if (count > 0)
					{
						// Duration or delay was assigned
						if (!duration_found)
						{
							duration_found = true;
							animation.duration = number;
						}
						else if (!delay_found)
						{
							delay_found = true;
							animation.delay = number;
						}
						else
							return false;
					}
					else
					{
						// No 's' unit means num_iterations was found
						if (!num_iterations_found)
						{
							animation.num_iterations = Math::RoundToInteger(number);
							num_iterations_found = true;
						}
						else
							return false;
					}
				}
				else
				{
					// Must be an animation name
					animation.name = argument;
				}
			}
		}

		// Validate the parsed transition
		if (animation.name.empty() || animation.duration <= 0.0f || (animation.num_iterations < -1 || animation.num_iterations == 0))
		{
			return false;
		}

		animation_list.push_back(std::move(animation));
	}

	property.value = std::move(animation_list);
	property.unit = Unit::ANIMATION;

	return true;
}